

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasOwnProperty
               (Var instance,PropertyId propertyId,ScriptContext *requestContext,
               PropertyString *propString)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  RecyclableObject *obj;
  PolymorphicInlineCache *pPVar4;
  Type *pTVar5;
  Type *oldType;
  undefined4 *puVar6;
  bool local_95;
  PropertyCacheOperationInfo local_6b;
  undefined1 local_68 [5];
  PropertyCacheOperationInfo info;
  PropertyDescriptor desc;
  RecyclableObject *object;
  PropertyString *propString_local;
  ScriptContext *requestContext_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    instance_local._4_4_ = 0;
  }
  else {
    obj = UnsafeVarTo<Js::RecyclableObject>(instance);
    bVar2 = VarIs<Js::JavascriptProxy>(instance);
    if (bVar2) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_68);
      instance_local._4_4_ =
           GetOwnPropertyDescriptor(obj,propertyId,requestContext,(PropertyDescriptor *)local_68);
    }
    else {
      if (propString != (PropertyString *)0x0) {
        PropertyCacheOperationInfo::PropertyCacheOperationInfo(&local_6b);
        pPVar4 = PropertyString::GetLdElemInlineCache(propString);
        pTVar5 = RecyclableObject::GetType(obj);
        bVar2 = PolymorphicInlineCache::PretendTryGetProperty(pPVar4,pTVar5,&local_6b);
        if (bVar2) {
          if (local_6b.cacheType == CacheType_Local) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
            if (iVar3 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x49e,"(object->HasOwnProperty(propertyId))",
                                          "object->HasOwnProperty(propertyId)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            return 1;
          }
          if (local_6b.cacheType == CacheType_Proto) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
            if (iVar3 != 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x4a1,"(!object->HasOwnProperty(propertyId))",
                                          "!object->HasOwnProperty(propertyId)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            return 0;
          }
        }
        pPVar4 = PropertyString::GetStElemInlineCache(propString);
        pTVar5 = RecyclableObject::GetType(obj);
        oldType = RecyclableObject::GetType(obj);
        bVar2 = PolymorphicInlineCache::PretendTrySetProperty(pPVar4,pTVar5,oldType,&local_6b);
        if (bVar2) {
          if (local_6b.cacheType == CacheType_Local) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
            if (iVar3 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x4ad,"(object->HasOwnProperty(propertyId))",
                                          "object->HasOwnProperty(propertyId)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            return 1;
          }
          if (local_6b.cacheType == CacheType_LocalWithoutProperty) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
            if (iVar3 != 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x4b0,"(!object->HasOwnProperty(propertyId))",
                                          "!object->HasOwnProperty(propertyId)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            return 0;
          }
        }
      }
      local_95 = false;
      if (obj != (RecyclableObject *)0x0) {
        iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
        local_95 = iVar3 != 0;
      }
      instance_local._4_4_ = (uint)local_95;
    }
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::HasOwnProperty(
        Var instance,
        PropertyId propertyId,
        _In_ ScriptContext* requestContext,
        _In_opt_ PropertyString* propString)
    {
        if (TaggedNumber::Is(instance))
        {
            return FALSE;
        }
        RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);

        if (VarIs<JavascriptProxy>(instance))
        {
            PropertyDescriptor desc;
            return GetOwnPropertyDescriptor(object, propertyId, requestContext, &desc);
        }

        // If we have a PropertyString, attempt to shortcut the lookup by using its caches
        if (propString != nullptr)
        {
            PropertyCacheOperationInfo info;
            if (propString->GetLdElemInlineCache()->PretendTryGetProperty(object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_Proto:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
            if (propString->GetStElemInlineCache()->PretendTrySetProperty(object->GetType(), object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_LocalWithoutProperty:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
        }

        return object && object->HasOwnProperty(propertyId);
    }